

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall wtlgo::bf::ASTLoop::compute(ASTLoop *this,VM *vm)

{
  undefined8 *puVar1;
  long *plVar2;
  
  while( true ) {
    puVar1 = (undefined8 *)
             (**(code **)((long)((vm->tape)._M_t.
                                 super___uniq_ptr_impl<BasicTape,_std::default_delete<BasicTape>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_BasicTape_*,_std::default_delete<BasicTape>_>
                                 .super__Head_base<0UL,_BasicTape_*,_false>._M_head_impl)->
                                _vptr_BasicTape + 0x10))();
    plVar2 = (long *)(**(code **)(*(long *)*puVar1 + 0x20))();
    if (*plVar2 == 0) break;
    ASTBody::compute(&this->super_ASTBody,vm);
  }
  return;
}

Assistant:

void ASTLoop::compute(VM& vm) const {
    while(vm.tape->get()->get()) {
        ASTBody::compute(vm);
    }
}